

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

string * __thiscall
pbrt::ThreadPool::ToString_abi_cxx11_(string *__return_storage_ptr__,ThreadPool *this)

{
  mutex *__mutex;
  ParallelJob *pPVar1;
  bool bVar2;
  bool *in_R8;
  string s;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p =
       (pointer)((long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  StringPrintf<unsigned_long,bool_const&>
            (&local_90,(pbrt *)"[ ThreadPool threads.size(): %d shutdownThreads: %s ",
             (char *)&local_70,(unsigned_long *)&this->shutdownThreads,in_R8);
  __mutex = &this->jobListMutex;
  bVar2 = std::mutex::try_lock(__mutex);
  if (bVar2) {
    std::__cxx11::string::append((char *)&local_90);
    while (pPVar1 = this->jobList, pPVar1 != (ParallelJob *)0x0) {
      (*pPVar1->_vptr_ParallelJob[4])(&local_50,pPVar1);
      std::operator+(&local_70,&local_50," ");
      std::__cxx11::string::append((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      this = (ThreadPool *)&pPVar1->next;
    }
    std::__cxx11::string::append((char *)&local_90);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    std::__cxx11::string::append((char *)&local_90);
  }
  std::operator+(__return_storage_ptr__,&local_90,"]");
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string ThreadPool::ToString() const {
    std::string s = StringPrintf("[ ThreadPool threads.size(): %d shutdownThreads: %s ",
                                 threads.size(), shutdownThreads);
    if (jobListMutex.try_lock()) {
        s += "jobList: [ ";
        ParallelJob *job = jobList;
        while (job) {
            s += job->ToString() + " ";
            job = job->next;
        }
        s += "] ";
        jobListMutex.unlock();
    } else
        s += "(job list mutex locked) ";
    return s + "]";
}